

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolOccurrenceReplacement.cpp
# Opt level: O2

Term * __thiscall SymbolOccurrenceReplacement::process(SymbolOccurrenceReplacement *this,Term *term)

{
  uint *this_00;
  uint uVar1;
  Formula *pFVar2;
  TermList TVar3;
  TermList TVar4;
  TermList TVar5;
  Term *pTVar6;
  ulong uVar7;
  NotImplementedException *this_01;
  byte bVar8;
  undefined8 in_RCX;
  VList *pVVar10;
  long lVar11;
  uint i;
  anon_union_8_2_f154dc0f_for_Term_10 *paVar12;
  ulong uVar13;
  Substitution substitution;
  Stack<Kernel::TermList> local_58;
  undefined8 uVar9;
  
  uVar1 = term->_functor;
  if (uVar1 < 0xfffffff9) {
    bVar8 = uVar1 != this->_symbol | this->_isPredicate;
    uVar9 = CONCAT71((int7)((ulong)in_RCX >> 8),bVar8);
    paVar12 = (anon_union_8_2_f154dc0f_for_Term_10 *)
              (term->_args + (*(uint *)&term->field_0xc & 0xfffffff));
    local_58._cursor = (TermList *)0x0;
    local_58._end = (TermList *)0x0;
    local_58._capacity = 0;
    local_58._stack = (TermList *)0x0;
    substitution._map._timestamp = 1;
    substitution._map._size = 0;
    substitution._map._deleted = 0;
    substitution._map._capacityIndex = 0;
    substitution._map._capacity = 0;
    substitution._map._nextExpansionOccupancy = 0;
    substitution._map._entries._0_4_ = 0;
    substitution._map._28_8_ = 0;
    substitution._map._afterLast._4_4_ = 0;
    if (bVar8 == 1) {
      while (TVar5._content = (paVar12->_sort)._content, ((uint)TVar5._content & 3) != 2) {
        if (((TVar5._content & 1) == 0) && ((*(byte *)(TVar5._content + 0x28) & 0x20) == 0)) {
          TVar5 = process(this,TVar5);
        }
        Lib::Stack<Kernel::TermList>::push(&local_58,TVar5);
        paVar12 = paVar12 + -1;
      }
    }
    else {
      pVVar10 = this->_argVars;
      while (pVVar10 != (VList *)0x0) {
        uVar1 = pVVar10->_head;
        pVVar10 = pVVar10->_tail;
        TVar5 = process(this,(paVar12->_sort)._content);
        Kernel::Substitution::bind(&substitution,uVar1,(sockaddr *)TVar5._content,(socklen_t)uVar9);
        paVar12 = paVar12 + -1;
      }
    }
    if (bVar8 == 0) {
      pTVar6 = Kernel::SubstHelper::applyImpl<false,Kernel::Substitution>
                         (this->_freshApplication,&substitution,false);
    }
    else {
      pTVar6 = Kernel::Term::create(term,local_58._stack);
    }
    Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              (&substitution._map);
    Lib::Stack<Kernel::TermList>::~Stack(&local_58);
  }
  else {
    this_00 = &term[-1]._functor;
    switch(uVar1) {
    case 0xfffffff9:
      Lib::DArray<Kernel::TermList>::DArray
                ((DArray<Kernel::TermList> *)&substitution,
                 (ulong)(*(uint *)&term->field_0xc & 0xfffffff));
      lVar11 = 0;
      for (uVar13 = 0; uVar7 = (ulong)(*(uint *)&term->field_0xc & 0xfffffff), uVar13 < uVar7;
          uVar13 = uVar13 + 1) {
        TVar5 = process(this,term->_args[uVar7 + lVar11]._content);
        *(uint64_t *)
         (CONCAT44(substitution._map._nextExpansionOccupancy,substitution._map._capacity) +
         uVar13 * 8) = TVar5._content;
        lVar11 = lVar11 + -1;
      }
      TVar3 = Kernel::Term::SpecialTermData::getSort((SpecialTermData *)this_00);
      TVar5._content._0_4_ = term[-1]._weight;
      TVar5._content._4_4_ = term[-1]._kboWeight;
      pTVar6 = Kernel::Term::createMatch
                         (TVar3,TVar5,*(uint *)&term->field_0xc & 0xfffffff,
                          (TermList *)
                          CONCAT44(substitution._map._nextExpansionOccupancy,
                                   substitution._map._capacity));
      Lib::DArray<Kernel::TermList>::~DArray((DArray<Kernel::TermList> *)&substitution);
      break;
    case 0xfffffffa:
      this_01 = (NotImplementedException *)__cxa_allocate_exception(0x38);
      Lib::NotImplementedException::NotImplementedException
                (this_01,
                 "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Shell/SymbolOccurrenceReplacement.cpp"
                 ,0x36);
      __cxa_throw(this_01,&Lib::NotImplementedException::typeinfo,Lib::Exception::~Exception);
    case 0xfffffffb:
      TVar5._content = *(uint64_t *)&term[-1]._maxRedLen;
      if ((TVar5._content & 3) == 0) {
        Kernel::Term::isBoolean((Term *)TVar5._content);
        TVar5._content = *(uint64_t *)&term[-1]._maxRedLen;
      }
      uVar1 = term[-1]._functor;
      pVVar10 = *(VList **)&term[-1]._weight;
      TVar5 = process(this,TVar5);
      TVar3 = process(this,term->_args[*(uint *)&term->field_0xc & 0xfffffff]._content);
      TVar4 = Kernel::Term::SpecialTermData::getSort((SpecialTermData *)this_00);
      pTVar6 = Kernel::Term::createTupleLet(uVar1,pVVar10,TVar5,TVar3,TVar4);
      return pTVar6;
    case 0xfffffffc:
      TVar5 = process(this,*(uint64_t *)this_00);
      pTVar6 = Kernel::Term::createTuple((Term *)TVar5._content);
      return pTVar6;
    case 0xfffffffd:
      pFVar2 = process(this,*(Formula **)this_00);
      pTVar6 = Kernel::Term::createFormula(pFVar2);
      return pTVar6;
    case 0xfffffffe:
      TVar5._content = *(uint64_t *)&term[-1]._maxRedLen;
      if ((TVar5._content & 3) == 0) {
        Kernel::Term::isBoolean((Term *)TVar5._content);
        TVar5._content = *(uint64_t *)&term[-1]._maxRedLen;
      }
      uVar1 = term[-1]._functor;
      pVVar10 = *(VList **)&term[-1]._weight;
      TVar5 = process(this,TVar5);
      TVar3 = process(this,term->_args[*(uint *)&term->field_0xc & 0xfffffff]._content);
      TVar4 = Kernel::Term::SpecialTermData::getSort((SpecialTermData *)this_00);
      pTVar6 = Kernel::Term::createLet(uVar1,pVVar10,TVar5,TVar3,TVar4);
      return pTVar6;
    case 0xffffffff:
      pFVar2 = process(this,*(Formula **)&term[-1]._functor);
      TVar5 = process(this,term->_args[*(uint *)&term->field_0xc & 0xfffffff]._content);
      TVar3 = process(this,term->_args[(ulong)(*(uint *)&term->field_0xc & 0xfffffff) - 1]._content)
      ;
      TVar4 = Kernel::Term::SpecialTermData::getSort((SpecialTermData *)this_00);
      pTVar6 = Kernel::Term::createITE(pFVar2,TVar5,TVar3,TVar4);
      return pTVar6;
    }
  }
  return pTVar6;
}

Assistant:

Term* SymbolOccurrenceReplacement::process(Term* term) {
  ASS(!term->isSort());

  if (term->isSpecial()) {
    Term::SpecialTermData* sd = term->getSpecialData();
    switch (term->specialFunctor()) {
      case SpecialFunctor::ITE:
        return Term::createITE(process(sd->getCondition()), process(*term->nthArgument(0)), process(*term->nthArgument(1)), sd->getSort());

      case SpecialFunctor::LET:
          if (_isPredicate == (sd->getBinding().isTerm() && sd->getBinding().term()->isBoolean())) {
            // function symbols, defined inside $let are expected to be
            // disjoint and fresh symbols are expected to be fresh
            ASS_NEQ(sd->getFunctor(), _symbol);
            //ASS_NEQ(sd->getFunctor(), _freshSymbol);
          }
          return Term::createLet(sd->getFunctor(), sd->getVariables(), process(sd->getBinding()), process(*term->nthArgument(0)), sd->getSort());

      case SpecialFunctor::FORMULA:
          return Term::createFormula(process(sd->getFormula()));

      case SpecialFunctor::LET_TUPLE:
        if (_isPredicate == (sd->getBinding().isTerm() && sd->getBinding().term()->isBoolean())) {
          // function symbols, defined inside $let are expected to be
          // disjoint and fresh symbols are expected to be fresh
          ASS_NEQ(sd->getFunctor(), _symbol);
          //ASS_NEQ(sd->getFunctor(), _freshSymbol);
        }
        return Term::createTupleLet(sd->getFunctor(), sd->getTupleSymbols(), process(sd->getBinding()), process(*term->nthArgument(0)), sd->getSort());

      case SpecialFunctor::TUPLE:
        return Term::createTuple(process(TermList(sd->getTupleTerm())).term());

      case SpecialFunctor::LAMBDA:
        NOT_IMPLEMENTED;
      case SpecialFunctor::MATCH: {
        DArray<TermList> terms(term->arity());
        for (unsigned i = 0; i < term->arity(); i++) {
          terms[i] = process(*term->nthArgument(i));
        }
        return Term::createMatch(sd->getSort(), sd->getMatchedSort(), term->arity(), terms.begin());
      }
    }
    ASSERTION_VIOLATION;
  }

  bool renaming = !_isPredicate && (term->functor() == _symbol);

  TermList* arg = term->args();
  TermStack arguments;
  Substitution substitution;

  if (renaming) {
    VList::Iterator fvit(_argVars);
    while (fvit.hasNext()) {
      unsigned var = fvit.next();
      substitution.bind(var, process(*arg));
      arg = arg->next();
    }
  } else {
    while (!arg->isEmpty()) {
      if(arg->isVar() || arg->term()->isSort()){
        arguments.push(*arg);
      } else {
        arguments.push(process(*arg));        
      }
      arg = arg->next();
    }  
  }

  if (renaming) {
    return SubstHelper::apply(_freshApplication, substitution);
  } else {
    return Term::create(term, arguments.begin());
  }
}